

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

int __thiscall
AbstractModuleClient::processReplyMsg(AbstractModuleClient *this,string *repType,TrodesMsg *msg)

{
  network_pimpl *pnVar1;
  bool bVar2;
  binarydata configdata;
  uint32_t time;
  binarydata statedata;
  binarydata bStack_148;
  TrodesConfig local_128;
  string local_f0;
  binarydata local_d0;
  string local_b0;
  string local_90;
  string local_70;
  TrodesConfig local_50;
  
  bVar2 = std::operator==(repType,"infoTime");
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_70,"4",(allocator *)&bStack_148);
    TrodesMsg::popcontents<unsigned_int>(msg,&local_70,(uint *)&local_128);
    std::__cxx11::string::~string((string *)&local_70);
    (*(this->super_MlmWrap)._vptr_MlmWrap[0xe])
              (this,(ulong)(uint)local_128.super_NetworkDataType._vptr_NetworkDataType);
  }
  else {
    bVar2 = std::operator==(repType,"infoTR");
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_90,"i",(allocator *)&bStack_148);
      TrodesMsg::popcontents<int>(msg,&local_90,(int *)&local_128);
      std::__cxx11::string::~string((string *)&local_90);
      (*(this->super_MlmWrap)._vptr_MlmWrap[0xf])
                (this,(ulong)(uint)local_128.super_NetworkDataType._vptr_NetworkDataType);
    }
    else {
      bVar2 = std::operator==(repType,"infoConf");
      if (bVar2) {
        TrodesConfig::TrodesConfig(&local_128);
        binarydata::binarydata(&bStack_148);
        binarydata::binarydata(&local_d0);
        std::__cxx11::string::string((string *)&local_b0,"nn",(allocator *)&local_f0);
        TrodesMsg::popcontents<binarydata,binarydata>(msg,&local_b0,&bStack_148,&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        TrodesConfig::decode(&local_128,&bStack_148);
        bVar2 = TrodesConfig::isValid(&local_128);
        if (bVar2) {
          TrodesConfig::TrodesConfig(&local_50,&local_128);
          MlmWrap::setTrodesConfig(&this->super_MlmWrap,&local_50);
          TrodesConfig::~TrodesConfig(&local_50);
        }
        pnVar1 = (this->super_MlmWrap).state;
        (*(pnVar1->super_NetworkDataType)._vptr_NetworkDataType[3])(pnVar1,&local_d0);
        network_pimpl::getTimestamp_endpoint_abi_cxx11_(&local_f0,(this->super_MlmWrap).state);
        subToTimestamps(this,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&bStack_148);
        TrodesConfig::~TrodesConfig(&local_128);
      }
    }
  }
  return 0;
}

Assistant:

int AbstractModuleClient::processReplyMsg(std::string repType, TrodesMsg &msg) {
    int rc = 0;
    if (repType == INFO_TIME) {
        uint32_t time;
        msg.popcontents("4", time);
        recv_time(time);
    }
    else if (repType == INFO_TIMERATE) {
        int timerate;
        msg.popcontents("i", timerate);
        recv_timerate(timerate);
    }
    else if (repType == INFO_CONFIG) {
        TrodesConfig newConfig;
        binarydata configdata;
        binarydata statedata;
        msg.popcontents("nn", configdata, statedata);
        newConfig.decode(configdata);
        if(newConfig.isValid())
            setTrodesConfig(newConfig);

        state->decode(statedata);
        subToTimestamps(state->getTimestamp_endpoint());
    }
    // else {
    //     std::cout << "[AMC]: Reply type [" << repType << "] not recognized.\n";
    // }
    return rc;
}